

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingreply.cpp
# Opt level: O0

QVariant * __thiscall QDBusPendingReplyBase::argumentAt(QDBusPendingReplyBase *this,int index)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  QDBusPendingCallPrivate *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QDBusMessage *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  QDBusPendingCallPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  bVar2 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22fc40);
  if (bVar2) {
    QVariant::QVariant((QVariant *)0x22fc50);
  }
  else {
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22fc5c);
    QDBusPendingCallPrivate::waitForFinished(in_RSI);
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22fc6e);
    QDBusMessage::arguments(in_stack_ffffffffffffffa8);
    QList<QVariant>::value((QList<QVariant> *)this_00,CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
    QList<QVariant>::~QList((QList<QVariant> *)0x22fc9d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QDBusPendingReplyBase::argumentAt(int index) const
{
    if (!d)
        return QVariant();

    d->waitForFinished();   // bypasses "const"

    return d->replyMessage.arguments().value(index);
}